

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

Port * __thiscall rtosc::Ports::apropos(Ports *this,char *path)

{
  Port *pPVar1;
  Ports *this_00;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  Port *pPVar5;
  Port *port;
  char *pcVar6;
  char *path_end;
  
  pcVar6 = (char *)0x0;
  if (path != (char *)0x0) {
    pcVar6 = path + (*path == '/');
  }
  pPVar1 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar5 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
    pcVar4 = pPVar5->name;
    pcVar3 = strchr(pcVar4,0x2f);
    if ((pcVar3 != (char *)0x0) &&
       (pcVar4 = rtosc_match_path(pcVar4,pcVar6,&path_end), pcVar4 != (char *)0x0)) {
      this_00 = pPVar5->ports;
      if (this_00 == (Ports *)0x0) {
        return pPVar5;
      }
      pcVar6 = strchr(pcVar6,0x2f);
      if (pcVar6[1] == '\0') {
        return pPVar5;
      }
      pPVar5 = apropos(this_00,path_end);
      return pPVar5;
    }
  }
  pPVar5 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pPVar5 == pPVar1) {
      return (Port *)0x0;
    }
    if (*pcVar6 != '\0') {
      pcVar4 = pPVar5->name;
      __n = strlen(pcVar6);
      iVar2 = strncmp(pcVar4,pcVar6,__n);
      if (iVar2 == 0) {
        return pPVar5;
      }
      pcVar4 = rtosc_match_path(pcVar4,pcVar6,(char **)0x0);
      if (pcVar4 != (char *)0x0) {
        return pPVar5;
      }
    }
    pPVar5 = pPVar5 + 1;
  } while( true );
}

Assistant:

const Port *Ports::apropos(const char *path) const
{
    if(path && path[0] == '/')
        ++path;

    const char* path_end;
    for(const Port &port: ports)
        if(strchr(port.name,'/') && rtosc_match_path(port.name,path, &path_end))
            return (port.ports && strchr(path,'/')[1])
                ? port.ports->apropos(path_end)
                : &port;

    //This is the lowest level, now find the best port
    for(const Port &port: ports)
        if(*path && (strstr(port.name, path)==port.name ||
                    rtosc_match_path(port.name, path, NULL)))
            return &port;

    return NULL;
}